

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::JavascriptRegExp::HasPropertyQuery
          (JavascriptRegExp *this,PropertyId propertyId,PropertyValueInfo *info)

{
  bool bVar1;
  PropertyQueryFlags PVar2;
  ScriptContext *this_00;
  ScriptConfiguration *this_01;
  PropertyQueryFlags local_50;
  PropertyQueryFlags local_4c;
  PropertyQueryFlags local_48;
  PropertyQueryFlags local_44;
  ScriptConfiguration *scriptConfig;
  PropertyValueInfo *info_local;
  PropertyId propertyId_local;
  JavascriptRegExp *this_local;
  
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  this_01 = ScriptContext::GetConfig(this_00);
  if ((propertyId != 0x153) && (propertyId != 0x1a0)) {
    if (propertyId == 0x1a2) {
      return Property_Found;
    }
    if (propertyId != 0x1a3) {
      if (propertyId == 0x1a4) {
        bVar1 = ScriptConfiguration::IsES2018RegExDotAllEnabled(this_01);
        if ((!bVar1) ||
           (bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_01), bVar1)) {
          local_48 = DynamicObject::HasPropertyQuery(&this->super_DynamicObject,0x1a4,info);
        }
        else {
          local_48 = Property_Found;
        }
        return local_48;
      }
      if (propertyId != 0x1a5) {
        if (propertyId == 0x1a6) {
          bVar1 = ScriptConfiguration::IsES6UnicodeExtensionsEnabled(this_01);
          if ((!bVar1) ||
             (bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_01), bVar1)) {
            local_4c = DynamicObject::HasPropertyQuery(&this->super_DynamicObject,0x1a6,info);
          }
          else {
            local_4c = Property_Found;
          }
          return local_4c;
        }
        if (propertyId == 0x1a7) {
          bVar1 = ScriptConfiguration::IsES6RegExStickyEnabled(this_01);
          if ((!bVar1) ||
             (bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_01), bVar1)) {
            local_50 = DynamicObject::HasPropertyQuery(&this->super_DynamicObject,0x1a7,info);
          }
          else {
            local_50 = Property_Found;
          }
          return local_50;
        }
        if (propertyId != 0x1e0) {
          PVar2 = DynamicObject::HasPropertyQuery(&this->super_DynamicObject,propertyId,info);
          return PVar2;
        }
      }
    }
  }
  bVar1 = ScriptConfiguration::IsES6RegExPrototypePropertiesEnabled(this_01);
  if (bVar1) {
    local_44 = DynamicObject::HasPropertyQuery(&this->super_DynamicObject,propertyId,info);
  }
  else {
    local_44 = Property_Found;
  }
  return local_44;
}

Assistant:

PropertyQueryFlags JavascriptRegExp::HasPropertyQuery(PropertyId propertyId, _Inout_opt_ PropertyValueInfo* info)
    {
        const ScriptConfiguration* scriptConfig = this->GetScriptContext()->GetConfig();

#define HAS_PROPERTY(ownProperty) \
        return (ownProperty ? PropertyQueryFlags::Property_Found : DynamicObject::HasPropertyQuery(propertyId, info));

        switch (propertyId)
        {
        case PropertyIds::lastIndex:
            return PropertyQueryFlags::Property_Found;
        case PropertyIds::global:
        case PropertyIds::multiline:
        case PropertyIds::ignoreCase:
        case PropertyIds::source:
        case PropertyIds::options:
            HAS_PROPERTY(!scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::dotAll:
            HAS_PROPERTY(scriptConfig->IsES2018RegExDotAllEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled())
        case PropertyIds::unicode:
            HAS_PROPERTY(scriptConfig->IsES6UnicodeExtensionsEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled())
        case PropertyIds::sticky:
            HAS_PROPERTY(scriptConfig->IsES6RegExStickyEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled())
        default:
            return DynamicObject::HasPropertyQuery(propertyId, info);
        }

#undef HAS_PROPERTY
    }